

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::AnyMetadata::InternalIs(AnyMetadata *this,Descriptor *descriptor)

{
  bool bVar1;
  string *psVar2;
  undefined1 local_60 [8];
  string full_name;
  string type_url;
  Descriptor *descriptor_local;
  AnyMetadata *this_local;
  
  psVar2 = ArenaStringPtr::GetNoArena_abi_cxx11_(this->type_url_);
  std::__cxx11::string::string((string *)(full_name.field_2._M_local_buf + 8),(string *)psVar2);
  std::__cxx11::string::string((string *)local_60);
  bVar1 = ParseAnyTypeUrl((string *)(full_name.field_2._M_local_buf + 8),(string *)local_60);
  if (bVar1) {
    psVar2 = Descriptor::full_name_abi_cxx11_(descriptor);
    this_local._7_1_ =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60,psVar2);
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(full_name.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool AnyMetadata::InternalIs(const Descriptor* descriptor) const {
  const string type_url = type_url_->GetNoArena();
  string full_name;
  if (!ParseAnyTypeUrl(type_url, &full_name)) {
    return false;
  }
  return full_name == descriptor->full_name();
}